

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall
cmCTestP4::IdentifyParser::IdentifyParser
          (IdentifyParser *this,cmCTestP4 *p4,char *prefix,string *rev)

{
  string *rev_local;
  char *prefix_local;
  cmCTestP4 *p4_local;
  IdentifyParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_00c17000;
  this->Rev = rev;
  cmsys::RegularExpression::RegularExpression(&this->RegexIdentify);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexIdentify,"^Change ([0-9]+) on");
  return;
}

Assistant:

IdentifyParser(cmCTestP4* p4, const char* prefix,
                 std::string& rev): Rev(rev)
    {
    this->SetLog(&p4->Log, prefix);
    this->RegexIdentify.compile("^Change ([0-9]+) on");
    }